

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O3

void poly_from_poly3(poly *out,poly3 *in)

{
  poly2 *ppVar1;
  poly2 *ppVar2;
  ulong uVar3;
  uint i;
  long lVar4;
  crypto_word_t cVar5;
  int iVar6;
  
  ppVar2 = &in->a;
  cVar5 = (in->a).v[0];
  uVar3 = ~(in->s).v[0];
  lVar4 = 0;
  iVar6 = 0;
  do {
    (out->field_0).v[lVar4] = (ushort)cVar5 & 1 | ((ushort)uVar3 & 1) - 1;
    iVar6 = iVar6 + 1;
    if (iVar6 == 0x40) {
      ppVar1 = &in->s;
      in = (poly3 *)((in->s).v + 1);
      uVar3 = ~ppVar1->v[1];
      cVar5 = ppVar2->v[1];
      ppVar2 = (poly2 *)(ppVar2->v + 1);
      iVar6 = 0;
    }
    else {
      uVar3 = uVar3 >> 1;
      cVar5 = cVar5 >> 1;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x2bd);
  (out->field_0).v[0x2bf] = 0;
  *(undefined4 *)((long)&out->field_0 + 0x57a) = 0;
  return;
}

Assistant:

static void poly_from_poly3(struct poly *out, const struct poly3 *in) {
  const crypto_word_t *words_s = in->s.v;
  const crypto_word_t *words_a = in->a.v;
  crypto_word_t word_s = ~(*words_s);
  crypto_word_t word_a = *words_a;
  unsigned shift = 0;

  for (unsigned i = 0; i < N; i++) {
    out->v[i] = (uint16_t)(word_s & 1) - 1;
    out->v[i] |= word_a & 1;
    word_s >>= 1;
    word_a >>= 1;
    shift++;

    if (shift == BITS_PER_WORD) {
      words_s++;
      words_a++;
      word_s = ~(*words_s);
      word_a = *words_a;
      shift = 0;
    }
  }

  poly_normalize(out);
}